

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O3

int ikcp_recv(ikcpcb *kcp,char *buffer,int len)

{
  IQUEUEHEAD *pIVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  IQUEUEHEAD *pIVar5;
  IQUEUEHEAD *pIVar6;
  IQUEUEHEAD *pIVar7;
  uint uVar8;
  IUINT32 IVar9;
  IQUEUEHEAD *pIVar10;
  uint uVar11;
  uint uVar12;
  
  if (kcp == (ikcpcb *)0x0) {
    __assert_fail("kcp",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/net_uv/kcp/ikcp.c"
                  ,0x16b,"int ikcp_recv(ikcpcb *, char *, int)");
  }
  pIVar1 = &kcp->rcv_queue;
  if (pIVar1 == (kcp->rcv_queue).next) {
    uVar11 = 0xffffffff;
  }
  else {
    uVar8 = ikcp_peeksize(kcp);
    if ((int)uVar8 < 0) {
      uVar11 = 0xfffffffe;
    }
    else {
      uVar2 = -len;
      if (0 < len) {
        uVar2 = len;
      }
      uVar11 = 0xfffffffd;
      if (uVar8 <= uVar2) {
        uVar2 = kcp->rcv_wnd;
        uVar3 = kcp->nrcv_que;
        uVar11 = 0;
        pIVar10 = (kcp->rcv_queue).next;
        do {
          if (pIVar10 == pIVar1) break;
          pIVar5 = pIVar10->next;
          if (buffer == (char *)0x0) {
            uVar12 = *(uint *)((long)&pIVar10[2].prev + 4);
            buffer = (char *)0x0;
          }
          else {
            memcpy(buffer,pIVar10 + 4,(ulong)*(uint *)((long)&pIVar10[2].prev + 4));
            uVar12 = *(uint *)((long)&pIVar10[2].prev + 4);
            buffer = buffer + uVar12;
          }
          iVar4 = *(int *)&pIVar10[1].prev;
          if (((kcp->logmask & 8) != 0) &&
             (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)) {
            ikcp_log(kcp,8,"recv sn=%lu",(ulong)*(uint *)((long)&pIVar10[2].next + 4));
          }
          if (-1 < len) {
            pIVar6 = pIVar10->next;
            pIVar7 = pIVar10->prev;
            pIVar6->prev = pIVar7;
            pIVar7->next = pIVar6;
            pIVar10->next = (IQUEUEHEAD *)0x0;
            pIVar10->prev = (IQUEUEHEAD *)0x0;
            if (ikcp_free_hook == (_func_void_void_ptr *)0x0) {
              free(pIVar10);
            }
            else {
              (*ikcp_free_hook)(pIVar10);
            }
            kcp->nrcv_que = kcp->nrcv_que - 1;
          }
          uVar11 = uVar11 + uVar12;
          pIVar10 = pIVar5;
        } while (iVar4 != 0);
        if (uVar11 != uVar8) {
          __assert_fail("len == peeksize",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/net_uv/kcp/ikcp.c"
                        ,0x199,"int ikcp_recv(ikcpcb *, char *, int)");
        }
        pIVar10 = (kcp->rcv_buf).next;
        if (&kcp->rcv_buf != pIVar10) {
          IVar9 = kcp->rcv_nxt;
          do {
            if ((IVar9 != *(IUINT32 *)((long)&pIVar10[2].next + 4)) ||
               (uVar11 = kcp->nrcv_que, kcp->rcv_wnd <= uVar11)) break;
            pIVar5 = pIVar10->next;
            pIVar6 = pIVar10->prev;
            pIVar5->prev = pIVar6;
            pIVar6->next = pIVar5;
            pIVar10->next = (IQUEUEHEAD *)0x0;
            pIVar10->prev = (IQUEUEHEAD *)0x0;
            kcp->nrcv_buf = kcp->nrcv_buf - 1;
            pIVar5 = (kcp->rcv_queue).prev;
            pIVar10->prev = pIVar5;
            pIVar10->next = pIVar1;
            pIVar5->next = pIVar10;
            (kcp->rcv_queue).prev = pIVar10;
            kcp->nrcv_que = uVar11 + 1;
            IVar9 = IVar9 + 1;
            kcp->rcv_nxt = IVar9;
            pIVar10 = (kcp->rcv_buf).next;
          } while (&kcp->rcv_buf != pIVar10);
        }
        uVar11 = uVar8;
        if ((uVar2 <= uVar3) && (kcp->nrcv_que < kcp->rcv_wnd)) {
          *(byte *)&kcp->probe = (byte)kcp->probe | 2;
        }
      }
    }
  }
  return uVar11;
}

Assistant:

int ikcp_recv(ikcpcb *kcp, char *buffer, int len)
{
	struct IQUEUEHEAD *p;
	int ispeek = (len < 0)? 1 : 0;
	int peeksize;
	int recover = 0;
	IKCPSEG *seg;
	assert(kcp);

	if (iqueue_is_empty(&kcp->rcv_queue))
		return -1;

	if (len < 0) len = -len;

	peeksize = ikcp_peeksize(kcp);

	if (peeksize < 0) 
		return -2;

	if (peeksize > len) 
		return -3;

	if (kcp->nrcv_que >= kcp->rcv_wnd)
		recover = 1;

	// merge fragment
	for (len = 0, p = kcp->rcv_queue.next; p != &kcp->rcv_queue; ) {
		int fragment;
		seg = iqueue_entry(p, IKCPSEG, node);
		p = p->next;

		if (buffer) {
			memcpy(buffer, seg->data, seg->len);
			buffer += seg->len;
		}

		len += seg->len;
		fragment = seg->frg;

		if (ikcp_canlog(kcp, IKCP_LOG_RECV)) {
			ikcp_log(kcp, IKCP_LOG_RECV, "recv sn=%lu", seg->sn);
		}

		if (ispeek == 0) {
			iqueue_del(&seg->node);
			ikcp_segment_delete(kcp, seg);
			kcp->nrcv_que--;
		}

		if (fragment == 0) 
			break;
	}

	assert(len == peeksize);

	// move available data from rcv_buf -> rcv_queue
	while (! iqueue_is_empty(&kcp->rcv_buf)) {
		IKCPSEG *seg = iqueue_entry(kcp->rcv_buf.next, IKCPSEG, node);
		if (seg->sn == kcp->rcv_nxt && kcp->nrcv_que < kcp->rcv_wnd) {
			iqueue_del(&seg->node);
			kcp->nrcv_buf--;
			iqueue_add_tail(&seg->node, &kcp->rcv_queue);
			kcp->nrcv_que++;
			kcp->rcv_nxt++;
		}	else {
			break;
		}
	}

	// fast recover
	if (kcp->nrcv_que < kcp->rcv_wnd && recover) {
		// ready to send back IKCP_CMD_WINS in ikcp_flush
		// tell remote my window size
		kcp->probe |= IKCP_ASK_TELL;
	}

	return len;
}